

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O1

FieldDescriptorProto * __thiscall
google::protobuf::DescriptorProto::add_field(DescriptorProto *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  void **ppvVar4;
  FieldDescriptorProto *pFVar5;
  
  iVar2 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  iVar3 = (this->field_).super_RepeatedPtrFieldBase.allocated_size_;
  if (iVar2 < iVar3) {
    ppvVar4 = (this->field_).super_RepeatedPtrFieldBase.elements_;
    (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pFVar5 = (FieldDescriptorProto *)ppvVar4[iVar2];
  }
  else {
    iVar2 = (this->field_).super_RepeatedPtrFieldBase.total_size_;
    if (iVar3 == iVar2) {
      internal::RepeatedPtrFieldBase::Reserve(&(this->field_).super_RepeatedPtrFieldBase,iVar2 + 1);
    }
    piVar1 = &(this->field_).super_RepeatedPtrFieldBase.allocated_size_;
    *piVar1 = *piVar1 + 1;
    pFVar5 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
    ppvVar4 = (this->field_).super_RepeatedPtrFieldBase.elements_;
    iVar2 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
    (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    ppvVar4[iVar2] = pFVar5;
  }
  return pFVar5;
}

Assistant:

inline ::google::protobuf::FieldDescriptorProto* DescriptorProto::add_field() {
  return field_.Add();
}